

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int analysisLoader(void *pData,int argc,char **argv,char **NotUsed)

{
  byte bVar1;
  ushort uVar2;
  Table *pTVar3;
  Index *aLog;
  long lVar4;
  char *pcVar5;
  Index *in_R8;
  long in_FS_OFFSET;
  Index fakeIdx;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined4 uStack_40;
  LogEst LStack_3c;
  undefined2 uStack_3a;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (((argv == (char **)0x0) || (*argv == (char *)0x0)) || (argv[2] == (char *)0x0))
  goto LAB_0015bb23;
  pTVar3 = sqlite3FindTable(*pData,*argv,*(char **)((long)pData + 8));
  if (pTVar3 == (Table *)0x0) goto LAB_0015bb23;
  pcVar5 = argv[1];
  if (pcVar5 == (char *)0x0) goto LAB_0015bac9;
  if (*argv != (char *)0x0) {
    lVar4 = 0;
    do {
      bVar1 = (*argv)[lVar4];
      in_R8 = (Index *)(ulong)(byte)pcVar5[lVar4];
      if (bVar1 == pcVar5[lVar4]) {
        if ((ulong)bVar1 == 0) goto LAB_0015baaa;
      }
      else if (""[bVar1] != *(uchar *)&in_R8[0x4953].azColl) break;
      lVar4 = lVar4 + 1;
    } while( true );
  }
  aLog = sqlite3FindIndex(*pData,pcVar5,*(char **)((long)pData + 8));
  pcVar5 = argv[2];
  if (aLog == (Index *)0x0) goto LAB_0015bacd;
  uVar2 = *(ushort *)&aLog->field_0x63;
LAB_0015ba70:
  *(ushort *)&aLog->field_0x63 = uVar2 & 0xfffb;
  decodeIntArray(pcVar5,aLog->nKeyCol + 1,(tRowcnt *)aLog->aiRowLogEst,(LogEst *)aLog,in_R8);
  aLog->field_0x63 = aLog->field_0x63 | 0x80;
  if (aLog->pPartIdxWhere != (Expr *)0x0) goto LAB_0015bb23;
  pTVar3->nRowLogEst = *aLog->aiRowLogEst;
  goto LAB_0015bb1f;
LAB_0015baaa:
  for (aLog = pTVar3->pIndex; aLog != (Index *)0x0; aLog = aLog->pNext) {
    uVar2 = *(ushort *)&aLog->field_0x63;
    if ((uVar2 & 3) == 2) {
      pcVar5 = argv[2];
      goto LAB_0015ba70;
    }
  }
LAB_0015bac9:
  pcVar5 = argv[2];
LAB_0015bacd:
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  _uStack_40 = CONCAT26(0xaaaa,CONCAT24(pTVar3->szTabRow,0xaaaaaaaa));
  decodeIntArray(pcVar5,1,(tRowcnt *)&pTVar3->nRowLogEst,(LogEst *)&local_98,in_R8);
  pTVar3->szTabRow = LStack_3c;
LAB_0015bb1f:
  *(byte *)&pTVar3->tabFlags = (byte)pTVar3->tabFlags | 0x10;
LAB_0015bb23:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

static int analysisLoader(void *pData, int argc, char **argv, char **NotUsed){
  analysisInfo *pInfo = (analysisInfo*)pData;
  Index *pIndex;
  Table *pTable;
  const char *z;

  assert( argc==3 );
  UNUSED_PARAMETER2(NotUsed, argc);

  if( argv==0 || argv[0]==0 || argv[2]==0 ){
    return 0;
  }
  pTable = sqlite3FindTable(pInfo->db, argv[0], pInfo->zDatabase);
  if( pTable==0 ){
    return 0;
  }
  if( argv[1]==0 ){
    pIndex = 0;
  }else if( sqlite3_stricmp(argv[0],argv[1])==0 ){
    pIndex = sqlite3PrimaryKeyIndex(pTable);
  }else{
    pIndex = sqlite3FindIndex(pInfo->db, argv[1], pInfo->zDatabase);
  }
  z = argv[2];

  if( pIndex ){
    tRowcnt *aiRowEst = 0;
    int nCol = pIndex->nKeyCol+1;
#ifdef SQLITE_ENABLE_STAT4
    /* Index.aiRowEst may already be set here if there are duplicate
    ** sqlite_stat1 entries for this index. In that case just clobber
    ** the old data with the new instead of allocating a new array.  */
    if( pIndex->aiRowEst==0 ){
      pIndex->aiRowEst = (tRowcnt*)sqlite3MallocZero(sizeof(tRowcnt) * nCol);
      if( pIndex->aiRowEst==0 ) sqlite3OomFault(pInfo->db);
    }
    aiRowEst = pIndex->aiRowEst;
#endif
    pIndex->bUnordered = 0;
    decodeIntArray((char*)z, nCol, aiRowEst, pIndex->aiRowLogEst, pIndex);
    pIndex->hasStat1 = 1;
    if( pIndex->pPartIdxWhere==0 ){
      pTable->nRowLogEst = pIndex->aiRowLogEst[0];
      pTable->tabFlags |= TF_HasStat1;
    }
  }else{
    Index fakeIdx;
    fakeIdx.szIdxRow = pTable->szTabRow;
#ifdef SQLITE_ENABLE_COSTMULT
    fakeIdx.pTable = pTable;
#endif
    decodeIntArray((char*)z, 1, 0, &pTable->nRowLogEst, &fakeIdx);
    pTable->szTabRow = fakeIdx.szIdxRow;
    pTable->tabFlags |= TF_HasStat1;
  }

  return 0;
}